

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTchr.cpp
# Opt level: O2

void __thiscall NaPNTeacher::initialize(NaPNTeacher *this,bool *starter)

{
  int iVar1;
  
  *starter = false;
  this->iUpdateCounter = 0;
  NaStdBackPropParams::operator=
            ((NaStdBackPropParams *)
             (this->bpe->_vptr_NaStdBackProp[-3] + -8 + (long)((this->bpe->nd).nHidNeurons + -0xb)),
             &this->lpar);
  iVar1 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[3])(this);
  if ((char)iVar1 != '\0') {
    NaStdBackProp::SetDebugLevel(this->bpe,2);
    return;
  }
  return;
}

Assistant:

void
NaPNTeacher::initialize (bool& starter)
{
    starter = false;
    iUpdateCounter = 0;

    // Assign parameters
    *(NaStdBackPropParams*)bpe = lpar;
    //qprop: *(NaQuickPropParams*)bpe = lpar;

    if(is_verbose())
	bpe->SetDebugLevel(2);
}